

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyBox::SetupBody
          (ChBodyEasyBox *this,double Xsize,double Ysize,double Zsize,double density,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChBoxShape *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined7 in_register_00000011;
  ChFrame<double> *iner;
  undefined1 auVar6 [16];
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  shared_ptr<chrono::ChBoxShape> vshape;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  shared_ptr<chrono::ChVisualModel> local_128;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  shared_ptr<chrono::ChVisualShape> local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  double local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  ChFrame<double> local_a8;
  
  local_d0 = Xsize * Ysize * Zsize * density;
  (this->super_ChBody).density = (float)density;
  local_118 = Xsize;
  uStack_110 = in_XMM0_Qb;
  local_108 = Ysize;
  uStack_100 = in_XMM1_Qb;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_d0);
  iner = &local_a8;
  local_a8.coord.pos.m_data[1] = local_d0 * 0.08333333333333333;
  local_a8._vptr_ChFrame =
       (_func_int **)((local_108 * local_108 + Zsize * Zsize) * local_a8.coord.pos.m_data[1]);
  local_a8.coord.pos.m_data[0] =
       (local_118 * local_118 + Zsize * Zsize) * local_a8.coord.pos.m_data[1];
  local_a8.coord.pos.m_data[1] =
       (local_118 * local_118 + local_108 * local_108) * local_a8.coord.pos.m_data[1];
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)iner);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0xdc,
                    "void chrono::ChBodyEasyBox::SetupBody(double, double, double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[3])();
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    local_e8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
    p_Stack_e0 = (material->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
    p_Var2 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_c8 = ZEXT816(0) << 0x20;
    local_b8 = 0.0;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.rot.m_data[1] = SUB328(ZEXT832(0),4);
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    local_a8.coord.pos.m_data[1] = local_a8.coord.rot.m_data[1];
    local_a8.coord.pos.m_data[2] = local_a8.coord.rot.m_data[2];
    (*peVar1->_vptr_ChCollisionModel[7])(peVar1,&local_e8);
    if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[4])();
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    iner = (ChFrame<double> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    this_00 = (ChBoxShape *)ChVisualShape::operator_new((ChVisualShape *)0x48,(size_t)iner);
    ChBoxShape::ChBoxShape(this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBoxShape*>
              (&_Stack_130,this_00);
    auVar6._8_8_ = uStack_110;
    auVar6._0_8_ = local_118;
    auVar4._8_8_ = uStack_100;
    auVar4._0_8_ = local_108;
    auVar6 = vunpcklpd_avx(auVar6,auVar4);
    auVar3._8_8_ = 0x3fe0000000000000;
    auVar3._0_8_ = 0x3fe0000000000000;
    auVar6 = vmulpd_avx512vl(auVar6,auVar3);
    *(undefined1 (*) [16])(this_00->gbox).Size.m_data = auVar6;
    (this_00->gbox).Size.m_data[2] = Zsize * 0.5;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[1]._M_use_count = 0;
    p_Var5[1]._M_weak_count = 0;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[2]._M_use_count = 0;
    p_Var5[2]._M_weak_count = 0;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[2]._M_use_count = 0;
    p_Var5[2]._M_weak_count = 0;
    p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[3]._M_use_count = 0;
    p_Var5[3]._M_weak_count = 0;
    local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_130._M_pi;
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_130._M_pi)->_M_use_count = (_Stack_130._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_130._M_pi)->_M_use_count = (_Stack_130._M_pi)->_M_use_count + 1;
      }
    }
    local_c8 = ZEXT816(0x3ff0000000000000);
    local_b8 = 0.0;
    local_b0 = 0.0;
    local_a8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
    local_a8.coord.pos.m_data[0] = 0.0;
    local_a8.coord.pos.m_data[1] = 0.0;
    local_a8.coord.pos.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[0] = 1.0;
    local_a8.coord.rot.m_data[1] = 0.0;
    local_a8.coord.rot.m_data[2] = 0.0;
    local_a8.coord.rot.m_data[3] = 0.0;
    local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00;
    ChMatrix33<double>::ChMatrix33(&local_a8.Amatrix,(ChQuaternion<double> *)local_c8);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var5 + 1),&local_f8,&local_a8);
    if (local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    local_128.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var5 + 1);
    local_128.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var5;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_128);
    if (local_128.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
    }
  }
  return;
}

Assistant:

void ChBodyEasyBox::SetupBody(double Xsize,
                              double Ysize,
                              double Zsize,
                              double density,
                              bool visualize,
                              bool collide,
                              std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * (Xsize * Ysize * Zsize);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>((1.0 / 12.0) * mmass * (pow(Ysize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Ysize, 2))));
    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddBox(material, Xsize * 0.5, Ysize * 0.5, Zsize * 0.5);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChBoxShape>();
        vshape->GetBoxGeometry().SetLengths(ChVector<>(Xsize, Ysize, Zsize));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}